

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPValidatePicture(WebPPicture *picture)

{
  WebPPicture *in_RDI;
  int local_4;
  
  if (in_RDI == (WebPPicture *)0x0) {
    local_4 = 0;
  }
  else if ((in_RDI->width < 1) || (in_RDI->height < 1)) {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_DIMENSION);
  }
  else if ((in_RDI->width < 1) ||
          (((0x1fffffff < in_RDI->width / 4 || (in_RDI->height < 1)) ||
           (0x1fffffff < in_RDI->height / 4)))) {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_DIMENSION);
  }
  else if ((in_RDI->colorspace == WEBP_YUV420) || (in_RDI->colorspace == WEBP_CSP_ALPHA_BIT)) {
    local_4 = 1;
  }
  else {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  return local_4;
}

Assistant:

int WebPValidatePicture(const WebPPicture* const picture) {
  if (picture == NULL) return 0;
  if (picture->width <= 0 || picture->height <= 0) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  if (picture->width <= 0 || picture->width / 4 > INT_MAX / 4 ||
      picture->height <= 0 || picture->height / 4 > INT_MAX / 4) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  if (picture->colorspace != WEBP_YUV420 &&
      picture->colorspace != WEBP_YUV420A) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  return 1;
}